

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

PAL_ERROR CorUnix::PALCS_DoActualWait(PAL_CRITICAL_SECTION *pPalCriticalSection)

{
  int iVar1;
  uint uVar2;
  PAL_ERROR palErr;
  int iRet;
  PAL_CRITICAL_SECTION *pPalCriticalSection_local;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&pPalCriticalSection->csndNativeData);
  if (iVar1 == 0) {
    do {
      if ((pPalCriticalSection->csndNativeData).iPredicate != 0) {
        (pPalCriticalSection->csndNativeData).iPredicate = 0;
        iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&pPalCriticalSection->csndNativeData);
        if (iVar1 != 0) {
          return 0x54f;
        }
        return 0;
      }
      uVar2 = pthread_cond_wait((pthread_cond_t *)&(pPalCriticalSection->csndNativeData).condition,
                                (pthread_mutex_t *)&pPalCriticalSection->csndNativeData);
    } while (uVar2 == 0);
    fprintf(_stderr,"] %s %s:%d","PALCS_DoActualWait",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x4ec);
    fprintf(_stderr,"Failed waiting on condition in CS %p [err=%d]\n",pPalCriticalSection,
            (ulong)uVar2);
    pthread_mutex_unlock((pthread_mutex_t *)&pPalCriticalSection->csndNativeData);
  }
  return 0x54f;
}

Assistant:

PAL_ERROR PALCS_DoActualWait(PAL_CRITICAL_SECTION * pPalCriticalSection)
    {
        int iRet;
        PAL_ERROR palErr = NO_ERROR;

        CS_TRACE("Trying to go to sleep [CS=%p]\n", pPalCriticalSection);

        // Lock the mutex
        iRet = pthread_mutex_lock(&pPalCriticalSection->csndNativeData.mutex);
        if (0 != iRet)
        {
            palErr = ERROR_INTERNAL_ERROR;
            goto PCDAW_exit;
        }

        CS_TRACE("Actually Going to sleep [CS=%p]\n", pPalCriticalSection);

        while (0 == pPalCriticalSection->csndNativeData.iPredicate)
        {
            // Wait on the condition
            iRet = pthread_cond_wait(&pPalCriticalSection->csndNativeData.condition,
                                     &pPalCriticalSection->csndNativeData.mutex);

            CS_TRACE("Got a signal on condition [pred=%d]!\n",
                           pPalCriticalSection->csndNativeData.iPredicate);
            if (0 != iRet)
            {
                // Failed: unlock the mutex and bail out
                ASSERT("Failed waiting on condition in CS %p [err=%d]\n",
                       pPalCriticalSection, iRet);
                pthread_mutex_unlock(&pPalCriticalSection->csndNativeData.mutex);
                palErr = ERROR_INTERNAL_ERROR;
                goto PCDAW_exit;
            }
        }

        // Reset the predicate
        pPalCriticalSection->csndNativeData.iPredicate = 0;

        // Unlock the mutex
        iRet = pthread_mutex_unlock(&pPalCriticalSection->csndNativeData.mutex);
        if (0 != iRet)
        {
            palErr = ERROR_INTERNAL_ERROR;
            goto PCDAW_exit;
        }

    PCDAW_exit:

        CS_TRACE("Just woken up [CS=%p]\n", pPalCriticalSection);

        return palErr;
    }